

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::drawTessCoordPoint
               (Surface *dst,TessPrimitiveType primitiveType,Vec3 *pt,RGBA *color,int size)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector<float,_2> local_64;
  Vector<float,_2> local_5c;
  Vector<float,_2> local_54;
  Vector<float,_2> local_4c;
  Vector<float,_2> local_44;
  Vec2 dstPos;
  int size_local;
  RGBA *color_local;
  Vec3 *pt_local;
  TessPrimitiveType primitiveType_local;
  Surface *dst_local;
  
  if (((anonymous_namespace)::
       drawTessCoordPoint(tcu::Surface&,deqp::gles31::Functional::(anonymous_namespace)::TessPrimitiveType,tcu::Vector<float,int>const&,tcu::RGBA_const&,int)
       ::triangleCorners == '\0') &&
     (iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   drawTessCoordPoint(tcu::Surface&,deqp::gles31::Functional::(anonymous_namespace)::TessPrimitiveType,tcu::Vector<float,int>const&,tcu::RGBA_const&,int)
                                   ::triangleCorners), iVar1 != 0)) {
    tcu::Vector<float,_2>::Vector(drawTessCoordPoint::triangleCorners,0.95,0.95);
    fVar3 = deFloatSqrt(0.75);
    tcu::Vector<float,_2>::Vector(drawTessCoordPoint::triangleCorners + 1,0.5,fVar3 * -0.9 + 0.95);
    tcu::Vector<float,_2>::Vector(drawTessCoordPoint::triangleCorners + 2,0.05,0.95);
    __cxa_guard_release(&(anonymous_namespace)::
                         drawTessCoordPoint(tcu::Surface&,deqp::gles31::Functional::(anonymous_namespace)::TessPrimitiveType,tcu::Vector<float,int>const&,tcu::RGBA_const&,int)
                         ::triangleCorners);
  }
  if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    fVar3 = tcu::Vector<float,_3>::x(pt);
    tcu::operator*((tcu *)&local_54,fVar3,drawTessCoordPoint::triangleCorners);
    fVar3 = tcu::Vector<float,_3>::y(pt);
    tcu::operator*((tcu *)&local_5c,fVar3,drawTessCoordPoint::triangleCorners + 1);
    tcu::operator+((tcu *)&local_4c,&local_54,&local_5c);
    fVar3 = tcu::Vector<float,_3>::z(pt);
    tcu::operator*((tcu *)&local_64,fVar3,drawTessCoordPoint::triangleCorners + 2);
    tcu::operator+((tcu *)&local_44,&local_4c,&local_64);
  }
  else if ((primitiveType == TESSPRIMITIVETYPE_QUADS) ||
          (primitiveType == TESSPRIMITIVETYPE_ISOLINES)) {
    fVar3 = tcu::Vector<float,_3>::x(pt);
    fVar6 = tcu::Vector<float,_3>::x(pt);
    fVar4 = tcu::Vector<float,_3>::y(pt);
    fVar5 = tcu::Vector<float,_3>::y(pt);
    tcu::Vector<float,_2>::Vector
              (&local_44,(1.0 - fVar3) * 0.1 + fVar6 * 0.9,(1.0 - fVar4) * 0.9 + fVar5 * 0.1);
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_44,-1.0);
  }
  fVar3 = tcu::Vector<float,_2>::x(&local_44);
  iVar1 = tcu::Surface::getWidth(dst);
  fVar6 = tcu::Vector<float,_2>::y(&local_44);
  iVar2 = tcu::Surface::getHeight(dst);
  drawPoint(dst,(int)(fVar3 * (float)iVar1),(int)(fVar6 * (float)iVar2),color,size);
  return;
}

Assistant:

static void drawTessCoordPoint (tcu::Surface& dst, TessPrimitiveType primitiveType, const Vec3& pt, const tcu::RGBA& color, int size)
{
	// \note These coordinates should match the description in the log message in TessCoordCase::iterate.

	static const Vec2 triangleCorners[3] =
	{
		Vec2(0.95f, 0.95f),
		Vec2(0.5f,  0.95f - 0.9f*deFloatSqrt(3.0f/4.0f)),
		Vec2(0.05f, 0.95f)
	};

	static const float quadIsolineLDRU[4] =
	{
		0.1f, 0.9f, 0.9f, 0.1f
	};

	const Vec2 dstPos = primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? pt.x()*triangleCorners[0]
																	 + pt.y()*triangleCorners[1]
																	 + pt.z()*triangleCorners[2]

					  : primitiveType == TESSPRIMITIVETYPE_QUADS ||
						primitiveType == TESSPRIMITIVETYPE_ISOLINES ? Vec2((1.0f - pt.x())*quadIsolineLDRU[0] + pt.x()*quadIsolineLDRU[2],
																		   (1.0f - pt.y())*quadIsolineLDRU[1] + pt.y()*quadIsolineLDRU[3])

					  : Vec2(-1.0f);

	drawPoint(dst, (int)(dstPos.x() * (float)dst.getWidth()), (int)(dstPos.y() * (float)dst.getHeight()), color, size);
}